

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fruit.cpp
# Opt level: O2

ostream * L13_4::operator<<(ostream *os,Fruit *d)

{
  std::operator<<(os,"Name: ");
}

Assistant:

std::ostream& operator<<(std::ostream &os, const Fruit &d) {
        os << "Name: " << d._name << std::endl;
        return os;
    }